

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O1

int mbedtls_sha512_finish_ret(mbedtls_sha512_context *ctx,uchar *output)

{
  long lVar1;
  ulong uVar2;
  uchar msglen [16];
  uchar local_28;
  undefined1 local_27;
  undefined1 local_26;
  undefined1 local_25;
  undefined1 local_24;
  undefined1 local_23;
  undefined1 local_22;
  byte local_21;
  undefined1 local_20;
  undefined1 local_1f;
  undefined1 local_1e;
  undefined1 local_1d;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  char local_19;
  
  uVar2 = ctx->total[0];
  lVar1 = ctx->total[1] << 3;
  local_21 = (byte)lVar1 | (byte)(uVar2 >> 0x3d);
  local_19 = (char)uVar2 * '\b';
  local_28 = (uchar)((ulong)lVar1 >> 0x38);
  local_27 = (undefined1)((ulong)lVar1 >> 0x30);
  local_26 = (undefined1)((ulong)lVar1 >> 0x28);
  local_25 = (undefined1)((ulong)lVar1 >> 0x20);
  local_24 = (undefined1)((ulong)lVar1 >> 0x18);
  local_23 = (undefined1)((ulong)lVar1 >> 0x10);
  local_22 = (undefined1)((ulong)lVar1 >> 8);
  local_20 = (undefined1)(uVar2 >> 0x35);
  local_1f = (undefined1)(uVar2 >> 0x2d);
  local_1e = (undefined1)(uVar2 >> 0x25);
  local_1d = (undefined1)(uVar2 >> 0x1d);
  local_1c = (undefined1)(uVar2 >> 0x15);
  local_1b = (undefined1)(uVar2 >> 0xd);
  local_1a = (undefined1)(uVar2 >> 5);
  uVar2 = (ulong)((uint)uVar2 & 0x7f);
  mbedtls_sha512_update_ret(ctx,sha512_padding,((ulong)(0x6f < uVar2) << 7 | 0x70) - uVar2);
  mbedtls_sha512_update_ret(ctx,&local_28,0x10);
  *output = *(uchar *)((long)ctx->state + 7);
  output[1] = *(uchar *)((long)ctx->state + 6);
  output[2] = *(uchar *)((long)ctx->state + 5);
  output[3] = *(uchar *)((long)ctx->state + 4);
  output[4] = *(uchar *)((long)ctx->state + 3);
  output[5] = *(uchar *)((long)ctx->state + 2);
  output[6] = *(uchar *)((long)ctx->state + 1);
  output[7] = (uchar)ctx->state[0];
  output[8] = *(uchar *)((long)ctx->state + 0xf);
  output[9] = *(uchar *)((long)ctx->state + 0xe);
  output[10] = *(uchar *)((long)ctx->state + 0xd);
  output[0xb] = *(uchar *)((long)ctx->state + 0xc);
  output[0xc] = *(uchar *)((long)ctx->state + 0xb);
  output[0xd] = *(uchar *)((long)ctx->state + 10);
  output[0xe] = *(uchar *)((long)ctx->state + 9);
  output[0xf] = (uchar)ctx->state[1];
  output[0x10] = *(uchar *)((long)ctx->state + 0x17);
  output[0x11] = *(uchar *)((long)ctx->state + 0x16);
  output[0x12] = *(uchar *)((long)ctx->state + 0x15);
  output[0x13] = *(uchar *)((long)ctx->state + 0x14);
  output[0x14] = *(uchar *)((long)ctx->state + 0x13);
  output[0x15] = *(uchar *)((long)ctx->state + 0x12);
  output[0x16] = *(uchar *)((long)ctx->state + 0x11);
  output[0x17] = (uchar)ctx->state[2];
  output[0x18] = *(uchar *)((long)ctx->state + 0x1f);
  output[0x19] = *(uchar *)((long)ctx->state + 0x1e);
  output[0x1a] = *(uchar *)((long)ctx->state + 0x1d);
  output[0x1b] = *(uchar *)((long)ctx->state + 0x1c);
  output[0x1c] = *(uchar *)((long)ctx->state + 0x1b);
  output[0x1d] = *(uchar *)((long)ctx->state + 0x1a);
  output[0x1e] = *(uchar *)((long)ctx->state + 0x19);
  output[0x1f] = (uchar)ctx->state[3];
  output[0x20] = *(uchar *)((long)ctx->state + 0x27);
  output[0x21] = *(uchar *)((long)ctx->state + 0x26);
  output[0x22] = *(uchar *)((long)ctx->state + 0x25);
  output[0x23] = *(uchar *)((long)ctx->state + 0x24);
  output[0x24] = *(uchar *)((long)ctx->state + 0x23);
  output[0x25] = *(uchar *)((long)ctx->state + 0x22);
  output[0x26] = *(uchar *)((long)ctx->state + 0x21);
  output[0x27] = (uchar)ctx->state[4];
  output[0x28] = *(uchar *)((long)ctx->state + 0x2f);
  output[0x29] = *(uchar *)((long)ctx->state + 0x2e);
  output[0x2a] = *(uchar *)((long)ctx->state + 0x2d);
  output[0x2b] = *(uchar *)((long)ctx->state + 0x2c);
  output[0x2c] = *(uchar *)((long)ctx->state + 0x2b);
  output[0x2d] = *(uchar *)((long)ctx->state + 0x2a);
  output[0x2e] = *(uchar *)((long)ctx->state + 0x29);
  output[0x2f] = (uchar)ctx->state[5];
  if (ctx->is384 == 0) {
    output[0x30] = *(uchar *)((long)ctx->state + 0x37);
    output[0x31] = *(uchar *)((long)ctx->state + 0x36);
    output[0x32] = *(uchar *)((long)ctx->state + 0x35);
    output[0x33] = *(uchar *)((long)ctx->state + 0x34);
    output[0x34] = *(uchar *)((long)ctx->state + 0x33);
    output[0x35] = *(uchar *)((long)ctx->state + 0x32);
    output[0x36] = *(uchar *)((long)ctx->state + 0x31);
    output[0x37] = (uchar)ctx->state[6];
    output[0x38] = *(uchar *)((long)ctx->state + 0x3f);
    output[0x39] = *(uchar *)((long)ctx->state + 0x3e);
    output[0x3a] = *(uchar *)((long)ctx->state + 0x3d);
    output[0x3b] = *(uchar *)((long)ctx->state + 0x3c);
    output[0x3c] = *(uchar *)((long)ctx->state + 0x3b);
    output[0x3d] = *(uchar *)((long)ctx->state + 0x3a);
    output[0x3e] = *(uchar *)((long)ctx->state + 0x39);
    output[0x3f] = (uchar)ctx->state[7];
  }
  return 0;
}

Assistant:

int mbedtls_sha512_finish_ret( mbedtls_sha512_context *ctx,
                               unsigned char output[64] )
{
    int ret;
    size_t last, padn;
    uint64_t high, low;
    unsigned char msglen[16];

    high = ( ctx->total[0] >> 61 )
         | ( ctx->total[1] <<  3 );
    low  = ( ctx->total[0] <<  3 );

    PUT_UINT64_BE( high, msglen, 0 );
    PUT_UINT64_BE( low,  msglen, 8 );

    last = (size_t)( ctx->total[0] & 0x7F );
    padn = ( last < 112 ) ? ( 112 - last ) : ( 240 - last );

    if( ( ret = mbedtls_sha512_update_ret( ctx, sha512_padding, padn ) ) != 0 )
            return( ret );

    if( ( ret = mbedtls_sha512_update_ret( ctx, msglen, 16 ) ) != 0 )
            return( ret );

    PUT_UINT64_BE( ctx->state[0], output,  0 );
    PUT_UINT64_BE( ctx->state[1], output,  8 );
    PUT_UINT64_BE( ctx->state[2], output, 16 );
    PUT_UINT64_BE( ctx->state[3], output, 24 );
    PUT_UINT64_BE( ctx->state[4], output, 32 );
    PUT_UINT64_BE( ctx->state[5], output, 40 );

    if( ctx->is384 == 0 )
    {
        PUT_UINT64_BE( ctx->state[6], output, 48 );
        PUT_UINT64_BE( ctx->state[7], output, 56 );
    }

    return( 0 );
}